

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  pointer *pppIVar2;
  uint uVar3;
  uint uVar4;
  pointer pvVar5;
  iterator __position;
  const_iterator __position_00;
  pointer ppIVar6;
  char *pcVar7;
  iterator __last;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int result;
  int iVar18;
  ContextState *pCVar19;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var20;
  size_t sVar21;
  const_iterator cVar22;
  uint uVar23;
  long lVar24;
  code *__comp;
  IReporter **curr;
  ContextState *pCVar25;
  undefined1 *puVar26;
  pointer ppIVar27;
  TestCase *pTVar28;
  anon_unknown_14 *this_00;
  ContextState *this_01;
  _Ios_Openmode _Var29;
  IReporter **curr_rep;
  ulong uVar30;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_398;
  iterator iStack_390;
  TestCase **local_388;
  undefined1 local_378 [64];
  undefined1 local_338 [16];
  undefined4 local_328;
  undefined4 uStack_324;
  int local_2b0;
  TestCase *local_298;
  ContextState *local_290;
  sigaltstack local_288;
  undefined1 local_270 [16];
  anon_union_24_2_13149d16_for_String_2 local_260;
  TestCase *local_248;
  char local_240 [16];
  ostream local_230 [512];
  
  pCVar25 = detail::g_cs;
  pCVar19 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar19;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar19->super_ContextOptions).no_colors;
  (pCVar19->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar19->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  *(undefined8 *)&(pCVar19->super_ContextOptions).field_0x8c = 0;
  *(undefined8 *)&pCVar19->field_0x94 = 0;
  *(undefined8 *)&pCVar19->field_0x9c = 0;
  pCVar19 = this->p;
  (pCVar19->super_ContextOptions).cout = (ostream *)&std::cout;
  (pCVar19->super_ContextOptions).cerr = (ostream *)&std::cerr;
  std::fstream::fstream(local_240);
  pCVar19 = this->p;
  bVar11 = (pCVar19->super_ContextOptions).out.field_0.buf[0x17];
  if ((char)bVar11 < '\0') {
    uVar23 = (pCVar19->super_ContextOptions).out.field_0.data.size;
  }
  else {
    uVar23 = 0x17 - (bVar11 & 0x1f);
  }
  if (uVar23 != 0) {
    if ((char)bVar11 < '\0') {
      _Var29 = (_Ios_Openmode)*(undefined8 *)&(pCVar19->super_ContextOptions).out.field_0;
    }
    else {
      _Var29 = (int)pCVar19 + (_S_trunc|_S_out);
    }
    std::fstream::open(local_240,_Var29);
    pCVar19 = this->p;
    (pCVar19->super_ContextOptions).cout = local_230;
  }
  this_01 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar5 = (pCVar19->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_338,"console",7);
    this_01 = (ContextState *)(pvVar5 + 8);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              ((vector<doctest::String,_std::allocator<doctest::String>_> *)this_01,
               (String *)local_338);
    if (((long)_local_328 < 0) &&
       (this_01 = (ContextState *)local_338._0_8_,
       (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
      operator_delete__((void *)local_338._0_8_);
    }
  }
  local_378._48_8_ = pCVar25;
  anon_unknown_14::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar19 = (ContextState *)
              anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      this_01 = pCVar19;
      if ((this_01->super_ContextOptions).out.field_0.buf[0xf] < '\0') {
        pTVar28 = (this_01->super_ContextOptions).currentTest;
      }
      else {
        pTVar28 = (TestCase *)&(this_01->super_ContextOptions).currentTest;
      }
      pCVar19 = this->p;
      pvVar5 = (pCVar19->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar9 = anon_unknown_14::matchesAny
                        ((anon_unknown_14 *)pTVar28,
                         *(char **)&pvVar5[8].
                                    super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                    ._M_impl.super__Vector_impl_data,
                         (vector<doctest::String,_std::allocator<doctest::String>_> *)
                         pvVar5[8].
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_finish,false,
                         (pCVar19->super_ContextOptions).case_sensitive);
      if (bVar9) {
        local_338._0_8_ =
             (**(code **)((long)&(this_01->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
        __position._M_current =
             (pCVar19->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar19->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
          _M_realloc_insert<doctest::IReporter*>
                    ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                     &pCVar19->reporters_currently_used,__position,(IReporter **)local_338);
        }
        else {
          *__position._M_current = (IReporter *)local_338._0_8_;
          pppIVar2 = &(pCVar19->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar2 = *pppIVar2 + 1;
        }
      }
      pCVar19 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
    } while (pCVar19 !=
             (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  anon_unknown_14::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar19 = (ContextState *)
              anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      this_01 = pCVar19;
      pCVar19 = this->p;
      __position_00._M_current =
           (pCVar19->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338._0_8_ =
           (**(code **)((long)&(this_01->super_ContextOptions).out.field_0 + 0x10))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar19->reporters_currently_used,__position_00,(value_type *)local_338);
      pCVar19 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
    } while (pCVar19 !=
             (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header
            );
  }
  pCVar19 = this->p;
  if (((((pCVar19->super_ContextOptions).no_run != false) ||
       ((pCVar19->super_ContextOptions).version != false)) ||
      ((pCVar19->super_ContextOptions).help != false)) ||
     ((pCVar19->super_ContextOptions).list_reporters == true)) {
    ppIVar27 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar27 != ppIVar6) {
      do {
        local_338._0_8_ = (ContextState *)0x0;
        local_338._8_8_ = (void *)0x0;
        _local_328 = 0;
        (**(*ppIVar27)->_vptr_IReporter)(*ppIVar27,local_338);
        ppIVar27 = ppIVar27 + 1;
      } while (ppIVar27 != ppIVar6);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar10 = std::__basic_file<char>::is_open();
    uVar8 = local_378._48_8_;
    if (cVar10 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = (ContextState *)uVar8;
    is_running_in_test = 0;
    pCVar19 = this->p;
    ppIVar27 = (pCVar19->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (pCVar19->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar27 != ppIVar6) {
      do {
        if (*ppIVar27 != (IReporter *)0x0) {
          (*(*ppIVar27)->_vptr_IReporter[0xd])();
        }
        ppIVar27 = ppIVar27 + 1;
      } while (ppIVar27 != ppIVar6);
      pCVar19 = this->p;
      ppIVar27 = (pCVar19->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar19->reporters_currently_used).
          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppIVar27) {
        (pCVar19->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppIVar27;
      }
    }
    if ((*(int *)&pCVar19->field_0x98 == 0) ||
       (iVar18 = 1, (pCVar19->super_ContextOptions).no_exitcode == true)) {
      iVar18 = 0;
    }
    goto LAB_00109cf5;
  }
  local_398._M_current = (TestCase **)0x0;
  iStack_390._M_current = (TestCase **)0x0;
  local_388 = (TestCase **)0x0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    pCVar19 = (ContextState *)
              detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_01 = pCVar19;
      local_338._0_8_ = (long)&(this_01->super_ContextOptions).binary_name.field_0 + 0x10;
      if (iStack_390._M_current == local_388) {
        std::
        vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
        _M_realloc_insert<doctest::detail::TestCase_const*>
                  ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                    *)&local_398,iStack_390,(TestCase **)local_338);
      }
      else {
        *iStack_390._M_current = (TestCase *)local_338._0_8_;
        iStack_390._M_current = iStack_390._M_current + 1;
      }
      pCVar19 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
    } while (pCVar19 !=
             (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = iStack_390._M_current;
  _Var20._M_current = local_398._M_current;
  pCVar19 = this->p;
  *(int *)&(pCVar19->super_ContextOptions).field_0x8c =
       (int)((ulong)((long)iStack_390._M_current - (long)local_398._M_current) >> 3);
  if (iStack_390._M_current != local_398._M_current) {
    this_01 = (ContextState *)&(pCVar19->super_ContextOptions).order_by;
    iVar18 = String::compare((String *)this_01,"file",true);
    if (iVar18 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar18 = String::compare((String *)this_01,"suite",true);
      if (iVar18 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar18 = String::compare((String *)this_01,"name",true);
        if (iVar18 != 0) {
          iVar18 = String::compare((String *)this_01,"rand",true);
          if (iVar18 == 0) {
            uVar23 = (pCVar19->super_ContextOptions).rand_seed;
            this_01 = (ContextState *)(ulong)uVar23;
            srand(uVar23);
            _Var20._M_current = local_398._M_current;
            for (uVar30 = (long)iStack_390._M_current - (long)local_398._M_current >> 3; uVar30 != 1
                ; uVar30 = uVar30 - 1) {
              iVar18 = rand();
              pTVar28 = *(TestCase **)((long)_Var20._M_current + uVar30 * 8 + -8);
              lVar24 = (long)(int)((ulong)(long)iVar18 % uVar30);
              *(TestCase **)((long)_Var20._M_current + uVar30 * 8 + -8) =
                   *(TestCase **)
                    ((long)&(((TestCaseData *)_Var20._M_current)->m_file).field_0 + lVar24 * 8);
              *(TestCase **)
               ((long)&(((TestCaseData *)_Var20._M_current)->m_file).field_0 + lVar24 * 8) = pTVar28
              ;
            }
          }
          goto LAB_00109e82;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var20,(__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                       )__last._M_current,__comp);
    this_01 = (ContextState *)_Var20._M_current;
  }
LAB_00109e82:
  local_260._8_8_ = local_270 + 8;
  local_270._8_4_ = _S_red;
  local_260.data.ptr = (char *)0x0;
  local_248 = (TestCase *)0x0;
  pCVar19 = this->p;
  local_260._16_8_ = local_260._8_8_;
  if (((pCVar19->super_ContextOptions).count == false) &&
     ((pCVar19->super_ContextOptions).list_test_cases != true)) {
    local_378._0_8_ = (ostream *)0x0;
    local_378._8_8_ = (ostream *)0x0;
    local_378._16_8_ = (TestCaseData **)0x0;
    bVar9 = true;
    if ((pCVar19->super_ContextOptions).list_test_suites == false) {
      ppIVar6 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar27 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar27 != ppIVar6;
          ppIVar27 = ppIVar27 + 1) {
        this_01 = (ContextState *)*ppIVar27;
        (**(code **)((this_01->super_ContextOptions).cout + 8))();
      }
      bVar9 = false;
    }
  }
  else {
    local_378._0_8_ = (ostream *)0x0;
    local_378._8_8_ = (ostream *)0x0;
    local_378._16_8_ = (TestCaseData **)0x0;
    bVar9 = true;
  }
  local_378._40_8_ = iStack_390._M_current;
  _Var20._M_current = local_398._M_current;
  if (local_398._M_current != iStack_390._M_current) {
    do {
      pCVar19 = (ContextState *)
                (((TestCase *)_Var20._M_current)->super_TestCaseData).m_file.field_0.data.ptr;
      local_290 = this->p;
      if ((pCVar19->super_ContextOptions).out.field_0.buf[8] == '\x01') {
        bVar11 = (local_290->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar11 = 0;
      }
      pCVar25 = pCVar19;
      if ((pCVar19->super_ContextOptions).binary_name.field_0.buf[7] < '\0') {
        pCVar25 = (ContextState *)(pCVar19->super_ContextOptions).cout;
      }
      pvVar5 = (local_290->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar17 = (local_290->super_ContextOptions).case_sensitive;
      local_378._56_8_ = _Var20._M_current;
      bVar12 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pCVar25,
                          *(char **)&(pvVar5->
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     )._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          (pvVar5->
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      bVar13 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pCVar25,
                          *(char **)&pvVar5[1].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[1].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      pTVar28 = (pCVar19->super_ContextOptions).currentTest;
      bVar14 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pTVar28,
                          *(char **)&pvVar5[2].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[2].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      local_298 = pTVar28;
      bVar15 = anon_unknown_14::matchesAny
                         ((anon_unknown_14 *)pTVar28,
                          *(char **)&pvVar5[3].
                                     super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                     ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[3].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      this_00 = *(anon_unknown_14 **)
                 ((long)&(pCVar19->super_ContextOptions).binary_name.field_0 + 0x10);
      local_378._32_8_ = pCVar19;
      bVar16 = anon_unknown_14::matchesAny
                         (this_00,*(char **)&pvVar5[4].
                                             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                             ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[4].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,true,bVar17);
      bVar17 = anon_unknown_14::matchesAny
                         (this_00,*(char **)&pvVar5[5].
                                             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>
                                             ._M_impl.super__Vector_impl_data,
                          (vector<doctest::String,_std::allocator<doctest::String>_> *)
                          pvVar5[5].
                          super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                          _M_impl.super__Vector_impl_data._M_finish,false,bVar17);
      pTVar28 = local_298;
      uVar8 = local_378._32_8_;
      uVar23 = *(uint *)&local_290->field_0x90;
      if ((!bVar17 && (bVar11 & 1) == 0) && ((bVar16 && (!bVar15 && !bVar13)) && (bVar14 && bVar12))
         ) {
        uVar23 = uVar23 + 1;
        *(uint *)&local_290->field_0x90 = uVar23;
      }
      uVar3 = (local_290->super_ContextOptions).first;
      uVar4 = (local_290->super_ContextOptions).last;
      this_01 = (ContextState *)CONCAT71((int7)((ulong)this_00 >> 8),uVar4 < uVar23);
      if ((uVar3 <= uVar23 && (uVar4 < uVar3 || uVar4 >= uVar23)) &&
          ((!bVar17 && (bVar11 & 1) == 0) &&
          ((bVar16 && (!bVar15 && !bVar13)) && (bVar14 && bVar12)))) {
        if ((local_290->super_ContextOptions).count == false) {
          if ((local_290->super_ContextOptions).list_test_cases == true) {
            local_338._0_8_ = local_378._32_8_;
            if (local_378._8_8_ == local_378._16_8_) {
              this_01 = (ContextState *)local_378;
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::_M_realloc_insert<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)this_01,(iterator)local_378._8_8_,(TestCaseData **)local_338);
            }
            else {
              *(undefined8 *)local_378._8_8_ = local_378._32_8_;
              local_378._8_8_ = local_378._8_8_ + 8;
            }
          }
          else if ((local_290->super_ContextOptions).list_test_suites == true) {
            sVar21 = strlen((char *)local_298);
            String::String((String *)local_338,(char *)pTVar28,(uint)sVar21);
            this_01 = (ContextState *)local_270;
            cVar22 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                             *)this_01,(key_type *)local_338);
            if (cVar22._M_node == (_Base_ptr)(local_270 + 8)) {
              cVar10 = **(char **)(uVar8 + 0x28);
              if (((long)_local_328 < 0) &&
                 (this_01 = (ContextState *)local_338._0_8_,
                 (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                operator_delete__((void *)local_338._0_8_);
              }
              if (cVar10 != '\0') {
                local_338._0_8_ = uVar8;
                std::
                vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                ::push_back((vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             *)local_378,(value_type *)local_338);
                pcVar7 = *(char **)(uVar8 + 0x28);
                sVar21 = strlen(pcVar7);
                String::String((String *)local_338,pcVar7,(uint)sVar21);
                this_01 = (ContextState *)local_270;
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>
                          ((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                            *)this_01,(String *)local_338);
                if (((long)_local_328 < 0) &&
                   (this_01 = (ContextState *)local_338._0_8_,
                   (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
                  operator_delete__((void *)local_338._0_8_);
                }
                puVar26 = &this->p->field_0x94;
                *(int *)puVar26 = *(int *)puVar26 + 1;
              }
            }
            else if (((long)_local_328 < 0) &&
                    (this_01 = (ContextState *)local_338._0_8_,
                    (ContextState *)local_338._0_8_ != (ContextState *)0x0)) {
              operator_delete__((void *)local_338._0_8_);
            }
          }
          else {
            (local_290->super_ContextOptions).currentTest = (TestCase *)local_378._32_8_;
            (local_290->super_CurrentTestCaseStats).failure_flags = 0;
            (local_290->super_CurrentTestCaseStats).seconds = 0.0;
            lVar24 = 0;
            do {
              LOCK();
              pcVar7 = (local_290->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                       lVar24 + -4;
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              UNLOCK();
              lVar24 = lVar24 + 0x40;
            } while (lVar24 != 0x800);
            pCVar19 = this->p;
            lVar24 = 0;
            do {
              LOCK();
              pcVar7 = (pCVar19->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar24 + -4;
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              UNLOCK();
              lVar24 = lVar24 + 0x40;
            } while (lVar24 != 0x800);
            std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::clear(&(this->p->subcasesPassed)._M_t);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar27 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar27 != ppIVar6;
                ppIVar27 = ppIVar27 + 1) {
              (*(*ppIVar27)->_vptr_IReporter[3])();
            }
            pCVar19 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar19->timer).m_ticks = (ticks_t)(local_338._0_8_ * 1000000 + local_338._8_8_);
            this_01 = this->p;
            bVar17 = true;
            do {
              this_01->should_reenter = false;
              this_01->subcasesCurrentMaxLevel = 0;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&this_01->subcasesStack,
                              (this_01->subcasesStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              LOCK();
              (this->p->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize
              ;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset(local_338 + 8,0,0x90);
              local_338._0_8_ = anon_unknown_14::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar26 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar24 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar24),
                          (sigaction *)local_338,(sigaction *)puVar26);
                lVar24 = lVar24 + 0x10;
                puVar26 = (undefined1 *)((long)puVar26 + 0x98);
              } while (lVar24 != 0x60);
              (**(code **)(uVar8 + 0x50))();
              anon_unknown_14::FatalConditionHandler::reset();
              anon_unknown_14::FatalConditionHandler::reset();
              this_01 = this->p;
              if (0 < (this_01->super_ContextOptions).abort_after) {
                puVar26 = &this_01->field_0xa0;
                iVar18 = 0;
                lVar24 = 0;
                do {
                  iVar18 = iVar18 + *(int *)((this_01->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar24 + -4);
                  lVar24 = lVar24 + 0x40;
                } while (lVar24 != 0x800);
                this_01 = this->p;
                if ((this_01->super_ContextOptions).abort_after <= iVar18 + *(int *)puVar26) {
                  piVar1 = &(this_01->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar1 = (byte)*piVar1 | 8;
                  bVar17 = false;
                }
              }
              if (this_01->should_reenter != true) break;
              if (bVar17) {
                ppIVar27 = (detail::g_cs->reporters_currently_used).
                           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppIVar6 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (ppIVar27 != ppIVar6) {
                  do {
                    (*(*ppIVar27)->_vptr_IReporter[4])(*ppIVar27,uVar8);
                    ppIVar27 = ppIVar27 + 1;
                  } while (ppIVar27 != ppIVar6);
                  this_01 = this->p;
                  if ((this_01->should_reenter & 1U) == 0) break;
                }
              }
            } while (bVar17);
            detail::ContextState::finalizeTestCaseData(this_01);
            ppIVar6 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar27 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar27 != ppIVar6;
                ppIVar27 = ppIVar27 + 1) {
              this_01 = (ContextState *)*ppIVar27;
              (**(code **)((this_01->super_ContextOptions).cout + 0x28))
                        (this_01,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar19 = this->p;
            (pCVar19->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar18 = (pCVar19->super_ContextOptions).abort_after;
            if ((0 < iVar18) && (iVar18 <= *(int *)&pCVar19->field_0xa0)) break;
          }
        }
      }
      else if (!bVar9) {
        ppIVar6 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar27 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar27 != ppIVar6;
            ppIVar27 = ppIVar27 + 1) {
          this_01 = (ContextState *)*ppIVar27;
          (**(code **)((this_01->super_ContextOptions).cout + 0x58))(this_01,uVar8);
        }
      }
      _Var20._M_current = (TestCase **)(local_378._56_8_ + 8);
    } while ((TestCase *)(local_378._56_8_ + 8) != (TestCase *)local_378._40_8_);
  }
  if (bVar9) {
    local_338._0_8_ = &(detail::g_cs->super_ContextOptions).field_0x8c;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338._0_8_ = (ContextState *)0x0;
    }
    local_338._8_8_ = local_378._0_8_;
    local_328 = (int)((ulong)(local_378._8_8_ - local_378._0_8_) >> 3);
    ppIVar27 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar27 != ppIVar6) {
      do {
        this_01 = (ContextState *)*ppIVar27;
        (**(_func_int **)(this_01->super_ContextOptions).cout)(this_01,local_338);
        ppIVar27 = ppIVar27 + 1;
      } while (ppIVar27 != ppIVar6);
    }
  }
  else {
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar27 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar27 != ppIVar6;
        ppIVar27 = ppIVar27 + 1) {
      this_01 = (ContextState *)*ppIVar27;
      (**(code **)((this_01->super_ContextOptions).cout + 0x10))
                (this_01,&(detail::g_cs->super_ContextOptions).field_0x8c);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01);
  uVar8 = local_378._48_8_;
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar10 = std::__basic_file<char>::is_open();
  if (cVar10 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = (ContextState *)uVar8;
  is_running_in_test = 0;
  pCVar19 = this->p;
  ppIVar27 = (pCVar19->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppIVar6 = (pCVar19->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar27 != ppIVar6) {
    do {
      if (*ppIVar27 != (IReporter *)0x0) {
        (*(*ppIVar27)->_vptr_IReporter[0xd])();
      }
      ppIVar27 = ppIVar27 + 1;
    } while (ppIVar27 != ppIVar6);
    pCVar19 = this->p;
    ppIVar27 = (pCVar19->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar19->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar27) {
      (pCVar19->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar27;
    }
  }
  if ((*(int *)&pCVar19->field_0x98 == 0) ||
     (iVar18 = 1, (pCVar19->super_ContextOptions).no_exitcode == true)) {
    iVar18 = 0;
  }
  if ((ostream *)local_378._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_378._0_8_);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree((_Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
               *)local_270);
  if ((TestCase *)local_398._M_current != (TestCase *)0x0) {
    operator_delete(local_398._M_current);
  }
LAB_00109cf5:
  std::fstream::~fstream(local_240);
  return iVar18;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}